

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O0

Options * __thiscall Options::demandOptionsToStr_abi_cxx11_(Options *this)

{
  _Setprecision _Var1;
  _Setw _Var2;
  void *this_00;
  ostream *poVar3;
  long in_RSI;
  stringstream local_1a8 [8];
  stringstream s;
  ostream local_198 [380];
  int local_1c;
  int w;
  Options *this_local;
  
  local_1c = 0x1a;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  this_00 = (void *)std::ostream::operator<<(local_198,std::left);
  poVar3 = (ostream *)std::ostream::operator<<(this_00,std::fixed);
  _Var1 = std::setprecision(4);
  std::operator<<(poVar3,_Var1);
  _Var2 = std::setw(local_1c);
  poVar3 = std::operator<<(local_198,_Var2);
  std::operator<<(poVar3,"DEMAND_MODEL");
  poVar3 = std::operator<<(local_198,(string *)(in_RSI + 0xa0));
  std::operator<<(poVar3,"\n");
  _Var2 = std::setw(local_1c);
  poVar3 = std::operator<<(local_198,_Var2);
  std::operator<<(poVar3,"DEMAND_PATTERN");
  poVar3 = std::operator<<(local_198,(string *)(in_RSI + 0x140));
  std::operator<<(poVar3,"\n");
  _Var2 = std::setw(local_1c);
  poVar3 = std::operator<<(local_198,_Var2);
  std::operator<<(poVar3,"DEMAND_MULTIPLIER");
  poVar3 = (ostream *)std::ostream::operator<<(local_198,*(double *)(in_RSI + 0x238));
  std::operator<<(poVar3,"\n");
  _Var2 = std::setw(local_1c);
  poVar3 = std::operator<<(local_198,_Var2);
  std::operator<<(poVar3,"MINIMUM_PRESSURE");
  poVar3 = (ostream *)std::ostream::operator<<(local_198,*(double *)(in_RSI + 0x240));
  std::operator<<(poVar3,"\n");
  _Var2 = std::setw(local_1c);
  poVar3 = std::operator<<(local_198,_Var2);
  std::operator<<(poVar3,"SERVICE_PRESSURE");
  poVar3 = (ostream *)std::ostream::operator<<(local_198,*(double *)(in_RSI + 0x248));
  std::operator<<(poVar3,"\n");
  _Var2 = std::setw(local_1c);
  poVar3 = std::operator<<(local_198,_Var2);
  std::operator<<(poVar3,"PRESSURE_EXPONENT");
  poVar3 = (ostream *)std::ostream::operator<<(local_198,*(double *)(in_RSI + 0x250));
  std::operator<<(poVar3,"\n\n");
  _Var2 = std::setw(local_1c);
  poVar3 = std::operator<<(local_198,_Var2);
  std::operator<<(poVar3,"LEAKAGE_MODEL");
  poVar3 = std::operator<<(local_198,(string *)(in_RSI + 0xc0));
  std::operator<<(poVar3,"\n");
  _Var2 = std::setw(local_1c);
  poVar3 = std::operator<<(local_198,_Var2);
  std::operator<<(poVar3,"LEAKAGE_COEFF1");
  poVar3 = (ostream *)std::ostream::operator<<(local_198,*(double *)(in_RSI + 0x260));
  std::operator<<(poVar3,"\n");
  _Var2 = std::setw(local_1c);
  poVar3 = std::operator<<(local_198,_Var2);
  std::operator<<(poVar3,"LEAKAGE_COEFF2");
  poVar3 = (ostream *)std::ostream::operator<<(local_198,*(double *)(in_RSI + 0x268));
  std::operator<<(poVar3,"\n");
  _Var2 = std::setw(local_1c);
  poVar3 = std::operator<<(local_198,_Var2);
  std::operator<<(poVar3,"EMITTER_EXPONENT");
  poVar3 = (ostream *)std::ostream::operator<<(local_198,*(double *)(in_RSI + 600));
  std::operator<<(poVar3,"\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

string Options::demandOptionsToStr()
{
    int w = 26;
    stringstream s;
    s << left << fixed << setprecision(4);
    s << setw(w) << "DEMAND_MODEL";
    s << stringOptions[DEMAND_MODEL] << "\n";
    s << setw(w) << "DEMAND_PATTERN";
    s << stringOptions[DEMAND_PATTERN_NAME] << "\n";
    s << setw(w) << "DEMAND_MULTIPLIER";
    s << valueOptions[DEMAND_MULTIPLIER] << "\n";
    s << setw(w) << "MINIMUM_PRESSURE";
    s << valueOptions[MINIMUM_PRESSURE] << "\n";
    s << setw(w) << "SERVICE_PRESSURE";
    s << valueOptions[SERVICE_PRESSURE] << "\n";
    s << setw(w) << "PRESSURE_EXPONENT";
    s << valueOptions[PRESSURE_EXPONENT] << "\n\n";

    s << setw(w) << "LEAKAGE_MODEL";
    s << stringOptions[LEAKAGE_MODEL] << "\n";
    s << setw(w) << "LEAKAGE_COEFF1";
    s << valueOptions[LEAKAGE_COEFF1] << "\n";
    s << setw(w) << "LEAKAGE_COEFF2";
    s << valueOptions[LEAKAGE_COEFF2] << "\n";
    s << setw(w) << "EMITTER_EXPONENT";
    s << valueOptions[EMITTER_EXPONENT] << "\n";

    return s.str();
}